

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressed_materialization.cpp
# Opt level: O1

unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>
__thiscall
duckdb::CompressedMaterialization::GetIntegralCompress
          (CompressedMaterialization *this,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *input,
          BaseStatistics *stats)

{
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var1;
  undefined8 uVar2;
  bool bVar3;
  pointer pEVar4;
  idx_t iVar5;
  uint64_t uVar6;
  idx_t iVar7;
  BoundConstantExpression *pBVar8;
  Optimizer *this_00;
  BaseStatistics *in_RCX;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *arguments_00;
  hugeint_t value;
  hugeint_t value_00;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  arguments;
  templated_unique_single_t compress_expr;
  Value result;
  Value min;
  Value max;
  Value range_value;
  ScalarFunction compress_function;
  BaseStatistics compress_stats;
  BoundConstantExpression *local_4a8;
  element_type *peStack_4a0;
  pointer local_498;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> local_488;
  long *local_480 [3];
  undefined1 local_468 [96];
  undefined1 local_408 [24];
  Value local_3f0;
  Value local_3b0;
  LogicalType local_370;
  LogicalType local_358;
  Value local_340;
  undefined1 local_300 [408];
  _Head_base<0UL,_duckdb::FunctionData_*,_false> local_168;
  ScalarFunction local_158;
  
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)stats);
  iVar5 = GetTypeIdSize((pEVar4->return_type).physical_type_);
  if ((iVar5 == 1) || (bVar3 = NumericStats::HasMinMax(in_RCX), !bVar3)) {
    this->optimizer = (Optimizer *)0x0;
    return (unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>_>
           )(unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>_>
             )this;
  }
  _Var1._M_head_impl =
       input[1].super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  NumericStats::Min(&local_3f0,in_RCX);
  NumericStats::Max(&local_3b0,in_RCX);
  bVar3 = Value::operator<(&local_3b0,&local_3f0);
  local_468._88_8_ = &pEVar4->return_type;
  if (bVar3) {
    value.upper = local_468._88_8_;
    value.lower = 0x7fffffffffffffff;
    Value::HUGEINT(&local_340,(Value *)0xffffffffffffffff,value);
  }
  else {
    local_4a8 = (BoundConstantExpression *)0x0;
    peStack_4a0 = (element_type *)0x0;
    local_498 = (pointer)0x0;
    pBVar8 = (BoundConstantExpression *)operator_new(0x98);
    Value::Value((Value *)local_300,&local_3b0);
    local_468._64_8_ = _Var1._M_head_impl;
    BoundConstantExpression::BoundConstantExpression(pBVar8,(Value *)local_300);
    local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
         (_func_int **)pBVar8;
    Value::~Value((Value *)local_300);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::BoundConstantExpression,std::default_delete<duckdb::BoundConstantExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)&local_4a8,
               (unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
                *)&local_158);
    if ((BoundConstantExpression *)
        local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function !=
        (BoundConstantExpression *)0x0) {
      (*(((Expression *)
         local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function)->
        super_BaseExpression)._vptr_BaseExpression[1])();
    }
    pBVar8 = (BoundConstantExpression *)operator_new(0x98);
    Value::Value((Value *)local_300,&local_3f0);
    BoundConstantExpression::BoundConstantExpression(pBVar8,(Value *)local_300);
    local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
         (_func_int **)pBVar8;
    Value::~Value((Value *)local_300);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::BoundConstantExpression,std::default_delete<duckdb::BoundConstantExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)&local_4a8,
               (unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
                *)&local_158);
    if ((BoundConstantExpression *)
        local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function !=
        (BoundConstantExpression *)0x0) {
      (*(((Expression *)
         local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function)->
        super_BaseExpression)._vptr_BaseExpression[1])();
    }
    uVar2 = local_468._88_8_;
    LogicalType::LogicalType((LogicalType *)local_480,(LogicalType *)local_468._88_8_);
    SubtractFunction::GetFunction(&local_158,(LogicalType *)uVar2,(LogicalType *)uVar2);
    arguments_00 = (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    *)local_408;
    local_408._0_8_ = local_4a8;
    local_408._8_8_ = peStack_4a0;
    local_408._16_8_ = local_498;
    local_4a8 = (BoundConstantExpression *)0x0;
    peStack_4a0 = (element_type *)0x0;
    local_498 = (pointer)0x0;
    local_488._M_head_impl = (FunctionData *)0x0;
    BoundFunctionExpression::BoundFunctionExpression
              ((BoundFunctionExpression *)local_300,(LogicalType *)local_480,&local_158,arguments_00
               ,(unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *
                )&local_488,false);
    if (local_488._M_head_impl != (FunctionData *)0x0) {
      (*(local_488._M_head_impl)->_vptr_FunctionData[1])();
    }
    local_488._M_head_impl = (FunctionData *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)local_408);
    local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
         (_func_int **)&PTR__ScalarFunction_01998f18;
    if (local_158.function_info.internal.
        super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_158.function_info.internal.
                 super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_158.function.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_158.function.super__Function_base._M_manager)
                ((_Any_data *)&local_158.function,(_Any_data *)&local_158.function,__destroy_functor
                );
    }
    BaseScalarFunction::~BaseScalarFunction(&local_158.super_BaseScalarFunction);
    LogicalType::~LogicalType((LogicalType *)local_480);
    LogicalType::LogicalType(&local_358,SQLNULL);
    Value::Value((Value *)local_468,&local_358);
    LogicalType::~LogicalType(&local_358);
    bVar3 = ExpressionExecutor::TryEvaluateScalar
                      ((ClientContext *)local_468._64_8_,(Expression *)local_300,(Value *)local_468)
    ;
    if (bVar3) {
      Value::Value(&local_340,(Value *)local_468);
    }
    else {
      value_00.upper = (int64_t)arguments_00;
      value_00.lower = 0x7fffffffffffffff;
      Value::HUGEINT(&local_340,(Value *)0xffffffffffffffff,value_00);
    }
    Value::~Value((Value *)local_468);
    local_300._0_8_ = &PTR__BoundFunctionExpression_019b21e0;
    if (local_168._M_head_impl != (FunctionData *)0x0) {
      (*(local_168._M_head_impl)->_vptr_FunctionData[1])();
    }
    local_168._M_head_impl = (FunctionData *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)(local_300 + 0x180));
    local_300._88_8_ = &PTR__ScalarFunction_01998f18;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_300._376_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_300._376_8_);
    }
    if ((element_type *)local_300._280_8_ != (element_type *)0x0) {
      (*(code *)local_300._280_8_)(local_300 + 0x108,local_300 + 0x108,3);
    }
    BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)(local_300 + 0x58));
    Expression::~Expression((Expression *)local_300);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)&local_4a8);
  }
  Value::~Value(&local_3b0);
  Value::~Value(&local_3f0);
  LogicalType::LogicalType((LogicalType *)local_300,UBIGINT);
  bVar3 = Value::DefaultTryCastAs(&local_340,(LogicalType *)local_300,false);
  LogicalType::~LogicalType((LogicalType *)local_300);
  if (!bVar3) {
    this->optimizer = (Optimizer *)0x0;
    goto LAB_006918ec;
  }
  uVar6 = UBigIntValue::Get(&local_340);
  LogicalType::LogicalType((LogicalType *)local_468);
  if (uVar6 < 0x100) {
    LogicalType::LogicalType((LogicalType *)local_300,UTINYINT);
LAB_00691527:
    local_468._0_2_ = local_300._0_2_;
  }
  else {
    if (uVar6 < 0x10000) {
      LogicalType::LogicalType((LogicalType *)local_300,USMALLINT);
      goto LAB_00691527;
    }
    if (uVar6 >> 0x20 == 0) {
      LogicalType::LogicalType((LogicalType *)local_300,UINTEGER);
    }
    else {
      LogicalType::LogicalType((LogicalType *)local_300,UBIGINT);
    }
    LogicalType::operator=((LogicalType *)local_468,(LogicalType *)local_300);
  }
  LogicalType::~LogicalType((LogicalType *)local_300);
  iVar5 = GetTypeIdSize(local_468[1]);
  iVar7 = GetTypeIdSize((pEVar4->return_type).physical_type_);
  if (iVar5 == iVar7) {
    this->optimizer = (Optimizer *)0x0;
  }
  else {
    CMIntegralCompressFun::GetFunction
              ((ScalarFunction *)local_300,(LogicalType *)local_468._88_8_,(LogicalType *)local_468)
    ;
    local_4a8 = (BoundConstantExpression *)0x0;
    peStack_4a0 = (element_type *)0x0;
    local_498 = (pointer)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)&local_4a8,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               stats);
    NumericStats::Min(&local_3f0,in_RCX);
    pBVar8 = (BoundConstantExpression *)operator_new(0x98);
    Value::Value((Value *)&local_158,&local_3f0);
    BoundConstantExpression::BoundConstantExpression(pBVar8,(Value *)&local_158);
    local_3b0.type_._0_8_ = pBVar8;
    Value::~Value((Value *)&local_158);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::BoundConstantExpression,std::default_delete<duckdb::BoundConstantExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)&local_4a8,
               (unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
                *)&local_3b0);
    if ((BoundConstantExpression *)local_3b0.type_._0_8_ != (BoundConstantExpression *)0x0) {
      (**(code **)(*(long *)local_3b0.type_._0_8_ + 8))();
    }
    local_3b0.type_.id_ = INVALID;
    local_3b0.type_.physical_type_ = ~INVALID;
    local_3b0.type_._2_6_ = 0;
    Value::~Value(&local_3f0);
    local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
         (_func_int **)0x0;
    make_uniq<duckdb::BoundFunctionExpression,duckdb::LogicalType&,duckdb::ScalarFunction&,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,decltype(nullptr)>
              ((LogicalType *)local_480,(ScalarFunction *)local_468,
               (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)local_300,&local_4a8);
    LogicalType::LogicalType(&local_370,(LogicalType *)local_468);
    BaseStatistics::CreateEmpty((BaseStatistics *)&local_158,&local_370);
    LogicalType::~LogicalType(&local_370);
    BaseStatistics::CopyBase((BaseStatistics *)&local_158,in_RCX);
    Value::Value(&local_3b0,0);
    Value::DefaultCastAs(&local_3f0,&local_3b0,(LogicalType *)local_468,false);
    NumericStats::SetMin((BaseStatistics *)&local_158,&local_3f0);
    Value::~Value(&local_3f0);
    Value::~Value(&local_3b0);
    Value::DefaultCastAs(&local_3f0,&local_340,(LogicalType *)local_468,false);
    NumericStats::SetMax((BaseStatistics *)&local_158,&local_3f0);
    Value::~Value(&local_3f0);
    BaseStatistics::ToUnique((BaseStatistics *)local_408);
    this_00 = (Optimizer *)operator_new(0x10);
    local_3f0.type_._0_8_ = local_480[0];
    local_480[0] = (long *)0x0;
    local_3b0.type_.id_ = local_408[0];
    local_3b0.type_.physical_type_ = local_408[1];
    local_3b0.type_._2_6_ = local_408._2_6_;
    local_408._0_8_ = (BoundConstantExpression *)0x0;
    CompressExpression::CompressExpression
              ((CompressExpression *)this_00,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_3f0,
               (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                *)&local_3b0);
    uVar2 = local_3b0.type_._0_8_;
    this->optimizer = this_00;
    if ((BoundConstantExpression *)local_3b0.type_._0_8_ != (BoundConstantExpression *)0x0) {
      BaseStatistics::~BaseStatistics((BaseStatistics *)local_3b0.type_._0_8_);
      operator_delete((void *)uVar2);
    }
    local_3b0.type_.id_ = INVALID;
    local_3b0.type_.physical_type_ = ~INVALID;
    local_3b0.type_._2_6_ = 0;
    if ((long *)local_3f0.type_._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_3f0.type_._0_8_ + 8))();
    }
    uVar2 = local_408._0_8_;
    if ((BoundConstantExpression *)local_408._0_8_ != (BoundConstantExpression *)0x0) {
      BaseStatistics::~BaseStatistics((BaseStatistics *)local_408._0_8_);
      operator_delete((void *)uVar2);
    }
    BaseStatistics::~BaseStatistics((BaseStatistics *)&local_158);
    if (local_480[0] != (long *)0x0) {
      (**(code **)(*local_480[0] + 8))();
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)&local_4a8);
    local_300._0_8_ = &PTR__ScalarFunction_01998f18;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_300._288_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_300._288_8_);
    }
    if ((pointer)local_300._192_8_ != (pointer)0x0) {
      (*(code *)local_300._192_8_)(local_300 + 0xb0,local_300 + 0xb0,3);
    }
    BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_300);
  }
  LogicalType::~LogicalType((LogicalType *)local_468);
LAB_006918ec:
  Value::~Value(&local_340);
  return (unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>_>)
         (unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>_>)
         this;
}

Assistant:

unique_ptr<CompressExpression> CompressedMaterialization::GetIntegralCompress(unique_ptr<Expression> input,
                                                                              const BaseStatistics &stats) {
	const auto &type = input->return_type;
	if (GetTypeIdSize(type.InternalType()) == 1 || !NumericStats::HasMinMax(stats)) {
		return nullptr;
	}

	// Get range and cast to UBIGINT (might fail for HUGEINT, in which case we just return)
	Value range_value = GetIntegralRangeValue(context, type, stats);
	if (!range_value.DefaultTryCastAs(LogicalType::UBIGINT)) {
		return nullptr;
	}

	// Get the smallest type that the range can fit into
	const auto range = UBigIntValue::Get(range_value);
	LogicalType cast_type;
	if (range <= NumericLimits<uint8_t>().Maximum()) {
		cast_type = LogicalType::UTINYINT;
	} else if (range <= NumericLimits<uint16_t>().Maximum()) {
		cast_type = LogicalType::USMALLINT;
	} else if (range <= NumericLimits<uint32_t>().Maximum()) {
		cast_type = LogicalType::UINTEGER;
	} else {
		D_ASSERT(range <= NumericLimits<uint64_t>().Maximum());
		cast_type = LogicalType::UBIGINT;
	}

	// Check if type that fits the range is smaller than the input type
	if (GetTypeIdSize(cast_type.InternalType()) == GetTypeIdSize(type.InternalType())) {
		return nullptr;
	}
	D_ASSERT(GetTypeIdSize(cast_type.InternalType()) < GetTypeIdSize(type.InternalType()));

	// Compressing will yield a benefit
	auto compress_function = CMIntegralCompressFun::GetFunction(type, cast_type);
	vector<unique_ptr<Expression>> arguments;
	arguments.emplace_back(std::move(input));
	arguments.emplace_back(make_uniq<BoundConstantExpression>(NumericStats::Min(stats)));
	auto compress_expr =
	    make_uniq<BoundFunctionExpression>(cast_type, compress_function, std::move(arguments), nullptr);

	auto compress_stats = BaseStatistics::CreateEmpty(cast_type);
	compress_stats.CopyBase(stats);
	NumericStats::SetMin(compress_stats, Value(0).DefaultCastAs(cast_type));
	NumericStats::SetMax(compress_stats, range_value.DefaultCastAs(cast_type));

	return make_uniq<CompressExpression>(std::move(compress_expr), compress_stats.ToUnique());
}